

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O0

uint __thiscall
rc::detail::BitStream<rc::Random>::next<unsigned_int>(BitStream<rc::Random> *this,uint nbits)

{
  uint nbits_00;
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Number NVar4;
  unsigned_long uVar5;
  Random *in_stack_ffffffffffffffb0;
  unsigned_long bits;
  uint local_28;
  int n;
  int wantBits;
  uint value;
  BitStream<rc::Random> *pBStack_18;
  int nbits_local;
  BitStream<rc::Random> *this_local;
  
  value = nbits;
  pBStack_18 = this;
  wantBits = numBits<unsigned_int>();
  puVar3 = (uint *)std::min<int>((int *)&value,&wantBits);
  local_28 = *puVar3;
  if (local_28 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    n = 0;
    value = local_28;
    for (; 0 < (int)local_28; local_28 = local_28 - nbits_00) {
      if (this->m_numBits == 0) {
        NVar4 = Random::next(in_stack_ffffffffffffffb0);
        this->m_bits = NVar4;
        iVar1 = numBits<unsigned_long>();
        this->m_numBits = iVar1 + this->m_numBits;
      }
      puVar3 = (uint *)std::min<int>(&this->m_numBits,(int *)&local_28);
      nbits_00 = *puVar3;
      in_stack_ffffffffffffffb0 = (Random *)this->m_bits;
      uVar5 = bitMask<unsigned_long>(nbits_00);
      n = n | (uint)(((ulong)in_stack_ffffffffffffffb0 & uVar5) <<
                    ((char)value - (char)local_28 & 0x3fU));
      uVar2 = numBits<unsigned_long>();
      if (nbits_00 < uVar2) {
        this->m_bits = this->m_bits >> ((byte)nbits_00 & 0x3f);
      }
      this->m_numBits = this->m_numBits - nbits_00;
    }
    this_local._4_4_ = n;
  }
  return this_local._4_4_;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}